

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

char * __thiscall FileReader::Gets(FileReader *this,char *strbuf,int len)

{
  long lVar1;
  long lVar2;
  int old;
  char *p;
  int len_local;
  char *strbuf_local;
  FileReader *this_local;
  
  if ((len < 1) || (this->StartPos + this->Length <= this->FilePos)) {
    this_local = (FileReader *)0x0;
  }
  else {
    this_local = (FileReader *)fgets(strbuf,len,(FILE *)this->File);
    if (this_local != (FileReader *)0x0) {
      lVar1 = this->FilePos;
      lVar2 = ftell((FILE *)this->File);
      this->FilePos = lVar2;
      if (this->Length < this->FilePos - this->StartPos) {
        strbuf[(this->Length - (long)(int)lVar1) + this->StartPos] = '\0';
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char *FileReader::Gets(char *strbuf, int len)
{
	if (len <= 0 || FilePos >= StartPos + Length) return NULL;
	char *p = fgets(strbuf, len, File);
	if (p != NULL)
	{
		int old = FilePos;
		FilePos = ftell(File);
		if (FilePos - StartPos > Length)
		{
			strbuf[Length - old + StartPos] = 0;
		}
	}
	return p;
}